

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O1

FieldTypeId HawkTracer::parser::get_type_id(uint64_t type_size,HT_MKCREFLECT_Types_Ext data_type)

{
  FieldTypeId FVar1;
  undefined *puVar2;
  runtime_error *this;
  
  switch(data_type) {
  case HT_MKCREFLECT_TYPES_EXT_STRUCT:
    FVar1 = STRUCT;
    break;
  case HT_MKCREFLECT_TYPES_EXT_STRING:
    FVar1 = STRING;
    break;
  case HT_MKCREFLECT_TYPES_EXT_INTEGER:
    if ((7 < type_size - 1) || ((0x8bU >> ((uint)(type_size - 1) & 0x1f) & 1) == 0)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"invalid size of signed integer");
LAB_0010d98c:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar2 = &DAT_0011244c;
    goto LAB_0010d93f;
  case HT_MKCREFLECT_TYPES_EXT_FLOAT:
  case HT_MKCREFLECT_TYPES_EXT_DOUBLE:
switchD_0010d8ee_caseD_4:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/event_klass.cpp"
                  ,0x54,
                  "FieldTypeId HawkTracer::parser::get_type_id(uint64_t, HT_MKCREFLECT_Types_Ext)");
  case HT_MKCREFLECT_TYPES_EXT_POINTER:
    FVar1 = POINTER;
    break;
  default:
    if (data_type != HT_MKCREFLECT_TYPES_EXT_UNSIGNED_INTEGER) goto switchD_0010d8ee_caseD_4;
    if ((7 < type_size - 1) || ((0x8bU >> ((uint)(type_size - 1) & 0x1f) & 1) == 0)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"invalid size of unsigned integer");
      goto LAB_0010d98c;
    }
    puVar2 = &DAT_0011242c;
LAB_0010d93f:
    FVar1 = *(FieldTypeId *)(puVar2 + type_size * 4 + -4);
  }
  return FVar1;
}

Assistant:

FieldTypeId get_type_id(uint64_t type_size, HT_MKCREFLECT_Types_Ext data_type)
{
    switch (data_type)
    {
    case HT_MKCREFLECT_TYPES_EXT_POINTER:
        return FieldTypeId::POINTER;
    case HT_MKCREFLECT_TYPES_EXT_STRING:
        return FieldTypeId::STRING;
    case HT_MKCREFLECT_TYPES_EXT_UNSIGNED_INTEGER:
        switch (type_size)
        {
        case 1: return FieldTypeId::UINT8;
        case 2: return FieldTypeId::UINT16;
        case 4: return FieldTypeId::UINT32;
        case 8: return FieldTypeId::UINT64;
        default:
            throw std::runtime_error("invalid size of unsigned integer");
        }
        break;
    case HT_MKCREFLECT_TYPES_EXT_INTEGER:
        switch (type_size)
        {
        case 1: return FieldTypeId::INT8;
        case 2: return FieldTypeId::INT16;
        case 4: return FieldTypeId::INT32;
        case 8: return FieldTypeId::INT64;
        default:
            throw std::runtime_error("invalid size of signed integer");
        }
        break;
    case HT_MKCREFLECT_TYPES_EXT_STRUCT:
        return FieldTypeId::STRUCT;
    default: assert(0); // TODO other types
        throw std::runtime_error("invalid type id");
    }
}